

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

hugeint_t duckdb::DivideOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t left,hugeint_t right)

{
  InternalException *this;
  hugeint_t hVar1;
  allocator local_59;
  hugeint_t right_local;
  hugeint_t left_local;
  string local_38;
  
  right_local.upper = right.upper;
  right_local.lower = right.lower;
  left_local.upper = left.upper;
  left_local.lower = left.lower;
  if (right_local.lower != 0 || right_local.upper != 0) {
    hVar1 = hugeint_t::operator/(&left_local,&right_local);
    return hVar1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Hugeint division by zero!",&local_59);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

hugeint_t DivideOperator::Operation(hugeint_t left, hugeint_t right) {
	if (right.lower == 0 && right.upper == 0) {
		throw InternalException("Hugeint division by zero!");
	}
	return left / right;
}